

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

TestCaseGroup * deqp::egl::createRobustnessTests(EglTestContext *eglTestCtx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 *puVar2;
  char *pcVar3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  int iVar10;
  TestCaseGroup *this;
  TestCaseGroup *pTVar11;
  TestCaseGroup *pTVar12;
  TestNode *pTVar13;
  RobustnessTestCase *pRVar14;
  TestCaseGroup *pTVar15;
  TestCase *pTVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int *piVar17;
  long *plVar18;
  long lVar19;
  undefined1 local_1020 [32];
  _Alloc_hider local_1000;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ff0 [2];
  size_type local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  TestCaseGroup *local_fa8;
  string local_fa0;
  TestCaseGroup *local_f80;
  TestCaseGroup *local_f78;
  TestCaseGroup *local_f70;
  string local_f68;
  string local_f48;
  string local_f28;
  string local_f08;
  string local_ee8;
  TestCaseGroup *local_ec8;
  TestCaseGroup *local_ec0;
  TestCaseGroup *local_eb8;
  TestCaseGroup *local_eb0;
  TestCaseGroup *local_ea8;
  string resetScenarioDescription;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  TestCaseGroup *local_a18;
  TestCaseGroup *local_a10;
  TestCaseGroup *local_a08;
  TestCaseGroup *local_a00;
  TestCaseGroup *local_9f8;
  TestCaseGroup *local_9f0;
  TestCaseGroup *local_9e8;
  TestCaseGroup *local_9e0;
  TestCaseGroup *local_9d8;
  ReadWriteType local_9d0;
  ResourceType local_9cc;
  ShaderType local_9c8;
  ContextResetType local_9c4;
  RobustAccessType local_9c0;
  ReadWriteType local_9bc;
  ResourceType local_9b8;
  ShaderType local_9b4;
  ContextResetType local_9b0;
  RobustAccessType local_9ac;
  ReadWriteType local_9a8;
  ResourceType local_9a4;
  ShaderType local_9a0;
  ContextResetType local_99c;
  RobustAccessType local_998;
  ReadWriteType local_994;
  ResourceType local_990;
  ShaderType local_98c;
  ContextResetType local_988;
  RobustAccessType local_984;
  ReadWriteType local_980;
  ResourceType local_97c;
  ShaderType local_978;
  ContextResetType local_974;
  RobustAccessType local_970;
  ReadWriteType local_96c;
  ResourceType local_968;
  ShaderType local_964;
  ContextResetType local_960;
  RobustAccessType local_95c;
  ReadWriteType local_958;
  ResourceType local_954;
  ShaderType local_950;
  ContextResetType local_94c;
  RobustAccessType local_948;
  ReadWriteType local_944;
  ResourceType local_940;
  ShaderType local_93c;
  ContextResetType local_938;
  RobustAccessType local_934;
  ReadWriteType local_930;
  ResourceType local_92c;
  ShaderType local_928;
  ContextResetType local_924;
  RobustAccessType local_920;
  ReadWriteType local_91c;
  ResourceType local_918;
  ShaderType local_914;
  ContextResetType local_910;
  RobustAccessType local_90c;
  ReadWriteType local_908;
  ResourceType local_904;
  ShaderType local_900;
  ContextResetType local_8fc;
  RobustAccessType local_8f8;
  ReadWriteType local_8f4;
  ResourceType local_8f0;
  ShaderType local_8ec;
  ContextResetType local_8e8;
  RobustAccessType local_8e4;
  ReadWriteType local_8e0;
  ResourceType local_8dc;
  ShaderType local_8d8;
  ContextResetType local_8d4;
  RobustAccessType local_8d0;
  ReadWriteType local_8cc;
  ResourceType local_8c8;
  ShaderType local_8c4;
  ContextResetType local_8c0;
  RobustAccessType local_8bc;
  ReadWriteType local_8b8;
  ResourceType local_8b4;
  ShaderType local_8b0;
  ContextResetType local_8ac;
  RobustAccessType local_8a8;
  ReadWriteType local_8a4;
  ResourceType local_8a0;
  ShaderType local_89c;
  ContextResetType local_898;
  RobustAccessType local_894;
  ReadWriteType local_890;
  ResourceType local_88c;
  ShaderType local_888;
  ContextResetType local_884;
  RobustAccessType local_880;
  ReadWriteType local_87c;
  ResourceType local_878;
  ShaderType local_874;
  ContextResetType local_870;
  RobustAccessType local_86c;
  ReadWriteType local_868;
  ResourceType local_864;
  ShaderType local_860;
  ContextResetType local_85c;
  RobustAccessType local_858;
  ReadWriteType local_854;
  ResourceType local_850;
  ShaderType local_84c;
  ContextResetType local_848;
  RobustAccessType local_844;
  ReadWriteType local_840;
  ResourceType local_83c;
  ShaderType local_838;
  ContextResetType local_834;
  RobustAccessType local_830;
  ReadWriteType local_82c;
  ResourceType local_828;
  ShaderType local_824;
  ContextResetType local_820;
  RobustAccessType local_81c;
  ReadWriteType local_818;
  ResourceType local_814;
  ShaderType local_810;
  ContextResetType local_80c;
  RobustAccessType local_808;
  ReadWriteType local_804;
  ResourceType local_800;
  ShaderType local_7fc;
  ContextResetType local_7f8;
  RobustAccessType local_7f4;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  TestCaseGroup *local_750;
  TestCaseGroup *local_748;
  TestCaseGroup *local_740;
  string recoverScenarioDescription;
  string sharedScenarioDescription;
  string queryScenarioDescription;
  string syncScenarioDescription;
  long *local_6b8;
  long local_6b0;
  long local_6a8 [2];
  long *local_698;
  long local_690;
  long local_688 [2];
  RobustAccessType local_678;
  ContextResetType CStack_674;
  ShaderType SStack_670;
  ResourceType RStack_66c;
  size_type local_668;
  long *local_660;
  long local_658;
  long local_650 [2];
  long *local_640;
  long local_638;
  long local_630 [2];
  RobustAccessType local_620;
  ContextResetType CStack_61c;
  ShaderType SStack_618;
  ResourceType RStack_614;
  size_type local_610;
  long *local_608;
  long local_600;
  long local_5f8 [2];
  long *local_5e8;
  long local_5e0;
  long local_5d8 [2];
  RobustAccessType local_5c8;
  ContextResetType CStack_5c4;
  ShaderType SStack_5c0;
  ResourceType RStack_5bc;
  size_type local_5b8;
  long *local_5b0;
  long local_5a8;
  long local_5a0 [2];
  long *local_590;
  long local_588;
  long local_580 [2];
  RobustAccessType local_570;
  ContextResetType CStack_56c;
  ShaderType SStack_568;
  ResourceType RStack_564;
  size_type local_560;
  undefined1 local_558 [32];
  _Alloc_hider local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528 [2];
  undefined8 local_508;
  undefined1 local_500 [32];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0 [2];
  undefined8 local_4b0;
  undefined1 local_4a8 [32];
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [2];
  undefined8 local_458;
  undefined1 local_450 [32];
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [2];
  undefined8 local_400;
  undefined1 local_3f8 [32];
  _Alloc_hider local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8 [2];
  undefined8 local_3a8;
  undefined1 local_3a0 [32];
  _Alloc_hider local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [2];
  undefined8 local_350;
  undefined1 local_348 [32];
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [2];
  undefined8 local_2f8;
  undefined1 local_2f0 [32];
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [2];
  undefined8 local_2a0;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [2];
  undefined8 local_248;
  undefined1 local_240 [32];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [2];
  undefined8 local_1f0;
  undefined1 local_1e8 [32];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  undefined8 local_198;
  undefined1 local_190 [32];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  undefined8 local_140;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [2];
  undefined8 local_e8;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  undefined8 local_90;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  size_type sStack_40;
  size_type local_38;
  
  local_ec8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_ec8,eglTestCtx,"robustness","KHR_robustness tests");
  local_ea8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_ea8,eglTestCtx,"create_context","Test valid context_creation attributes");
  local_eb8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_eb8,eglTestCtx,"reset_context","Test context resets scenarios")
  ;
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,eglTestCtx,"negative_context","Test invalid context creation attributes");
  local_eb0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_eb0,eglTestCtx,"shaders","Shader specific context reset tests")
  ;
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar11,eglTestCtx,"fixed_function_pipeline",
             "Fixed function pipeline context reset tests with robust context");
  local_a18 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_a18,eglTestCtx,"fixed_function_pipeline_non_robust",
             "Fixed function pipeline context reset tests with non-robust context");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"infinite_loop","Infinite loop scenarios");
  local_a08 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_a08,eglTestCtx,"out_of_bounds",
             "Out of bounds access scenarios with robust context");
  local_a10 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_a10,eglTestCtx,"out_of_bounds_non_robust",
             "Out of bounds access scenarios with non-robust context");
  resetScenarioDescription._M_dataplus._M_p = (pointer)&resetScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&resetScenarioDescription,"query error states and reset notifications","");
  syncScenarioDescription._M_dataplus._M_p = (pointer)&syncScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&syncScenarioDescription,"query sync status with getSynciv()","");
  queryScenarioDescription._M_dataplus._M_p = (pointer)&queryScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&queryScenarioDescription,
             "check availability of query result with getQueryObjectiv()","");
  sharedScenarioDescription._M_dataplus._M_p = (pointer)&sharedScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sharedScenarioDescription,
             "check reset notification is propagated to shared context","");
  recoverScenarioDescription._M_dataplus._M_p = (pointer)&recoverScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&recoverScenarioDescription,"delete the old context and create a new one","")
  ;
  local_f70 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f70,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  local_f78 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f78,eglTestCtx,"sync_status",
             "Tests that query the sync status after a context reset has occurred");
  local_f80 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f80,eglTestCtx,"query_status",
             "Tests that query the state of a query object after a context reset has occurred");
  local_ec0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_ec0,eglTestCtx,"shared_context_status",
             "Tests that query the state of a shared context after a reset has occurred");
  local_fa8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fa8,eglTestCtx,"recover_from_reset",
             "Tests that attempt to create a new context after a context has occurred");
  local_9d8 = pTVar12;
  local_740 = pTVar11;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_infiniteLoopCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"vertex","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,"Provoke a context reset in vertex shader and ","");
      local_d98._M_dataplus._M_p = (pointer)((ulong)local_d98._M_dataplus._M_p._4_4_ << 0x20);
      local_db8._M_dataplus._M_p = (pointer)((ulong)local_db8._M_dataplus._M_p._4_4_ << 0x20);
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases,(string *)local_1020,&local_fc8,
                 (ContextResetType *)&local_d98,(ShaderType *)&local_db8);
      local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa0,"fragment","");
      local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee8,"Provoke a context reset in fragment shader and ","");
      local_dd8._M_dataplus._M_p = (pointer)((ulong)local_dd8._M_dataplus._M_p._4_4_ << 0x20);
      local_df8._M_dataplus._M_p._0_4_ = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 1,&local_fa0,&local_ee8,
                 (ContextResetType *)&local_dd8,(ShaderType *)&local_df8);
      local_f08._M_dataplus._M_p = (pointer)&local_f08.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f08,"vertex_and_fragment","")
      ;
      local_f28._M_dataplus._M_p = (pointer)&local_f28.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f28,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_e18._M_dataplus._M_p = (pointer)((ulong)local_e18._M_dataplus._M_p._4_4_ << 0x20);
      local_e38._M_dataplus._M_p._0_4_ = 3;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 2,&local_f08,&local_f28,
                 (ContextResetType *)&local_e18,(ShaderType *)&local_e38);
      local_f48._M_dataplus._M_p = (pointer)&local_f48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f48,"compute","");
      local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f68,"Provoke a context reset in compute shader and ","");
      local_e58._M_dataplus._M_p = (pointer)((ulong)local_e58._M_dataplus._M_p._4_4_ << 0x20);
      local_e78._M_dataplus._M_p._0_4_ = 2;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 3,&local_f48,&local_f68,
                 (ContextResetType *)&local_e58,(ShaderType *)&local_e78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
        operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
        operator_delete(local_f48._M_dataplus._M_p,local_f48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f28._M_dataplus._M_p != &local_f28.field_2) {
        operator_delete(local_f28._M_dataplus._M_p,local_f28.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f08._M_dataplus._M_p != &local_f08.field_2) {
        operator_delete(local_f08._M_dataplus._M_p,local_f08.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
        operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
        operator_delete(local_fa0._M_dataplus._M_p,local_fa0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases);
    }
  }
  __lhs = &createRobustnessTests::s_infiniteLoopCases[0].m_description;
  lVar19 = 4;
  do {
    pTVar13 = (TestNode *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020,
                   __lhs,&resetScenarioDescription);
    uVar8 = local_1020._0_8_;
    local_88._0_8_ = local_88 + 0x10;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_68._M_p = (pointer)&local_58;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_38 = __lhs[1].field_2._M_allocated_capacity;
    local_48 = __lhs[1]._M_dataplus._M_p;
    sStack_40 = __lhs[1]._M_string_length;
    anon_unknown_1::BasicResetCase::BasicResetCase
              ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_88);
    tcu::TestNode::addChild((TestNode *)local_f70,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    pTVar13 = (TestNode *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&syncScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_5b0 = local_5a0;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5b0,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_590 = local_580;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_590,pcVar4,pcVar4 + __lhs->_M_string_length);
    pbVar1 = __lhs + 1;
    local_560 = __lhs[1].field_2._M_allocated_capacity;
    local_570 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_56c = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_568 = (ShaderType)__lhs[1]._M_string_length;
    RStack_564 = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_5b0,local_5a8 + (long)local_5b0);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_590,local_588 + (long)local_590);
    local_fd0 = local_560;
    local_ff0[1]._4_4_ = CStack_56c;
    local_ff0[1]._0_4_ = local_570;
    local_ff0[1]._12_4_ = RStack_564;
    local_ff0[1]._8_4_ = SStack_568;
    anon_unknown_1::ContextResetCase::ContextResetCase
              ((ContextResetCase *)pTVar13,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_0211ba20;
    tcu::TestNode::addChild((TestNode *)local_f78,pTVar13);
    if (local_590 != local_580) {
      operator_delete(local_590,local_580[0] + 1);
    }
    if (local_5b0 != local_5a0) {
      operator_delete(local_5b0,local_5a0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    pTVar13 = (TestNode *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&queryScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_608 = local_5f8;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_608,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_5e8 = local_5d8;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e8,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_5b8 = __lhs[1].field_2._M_allocated_capacity;
    local_5c8 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_5c4 = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_5c0 = (ShaderType)__lhs[1]._M_string_length;
    RStack_5bc = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_608,local_600 + (long)local_608);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_5e8,local_5e0 + (long)local_5e8);
    local_fd0 = local_5b8;
    local_ff0[1]._4_4_ = CStack_5c4;
    local_ff0[1]._0_4_ = local_5c8;
    local_ff0[1]._12_4_ = RStack_5bc;
    local_ff0[1]._8_4_ = SStack_5c0;
    anon_unknown_1::ContextResetCase::ContextResetCase
              ((ContextResetCase *)pTVar13,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_0211ba88;
    tcu::TestNode::addChild((TestNode *)local_f80,pTVar13);
    if (local_5e8 != local_5d8) {
      operator_delete(local_5e8,local_5d8[0] + 1);
    }
    if (local_608 != local_5f8) {
      operator_delete(local_608,local_5f8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    pRVar14 = (RobustnessTestCase *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&sharedScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_660 = local_650;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_660,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_640 = local_630;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_640,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_610 = __lhs[1].field_2._M_allocated_capacity;
    local_620 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_61c = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_618 = (ShaderType)__lhs[1]._M_string_length;
    RStack_614 = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_660,local_658 + (long)local_660);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_640,local_638 + (long)local_640);
    local_fd0 = local_610;
    local_ff0[1]._4_4_ = CStack_61c;
    local_ff0[1]._0_4_ = local_620;
    local_ff0[1]._12_4_ = RStack_614;
    local_ff0[1]._8_4_ = SStack_618;
    anon_unknown_1::RobustnessTestCase::RobustnessTestCase
              (pRVar14,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    (pRVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__RobustnessTestCase_0211baf0;
    tcu::TestNode::addChild((TestNode *)local_ec0,(TestNode *)pRVar14);
    if (local_640 != local_630) {
      operator_delete(local_640,local_630[0] + 1);
    }
    if (local_660 != local_650) {
      operator_delete(local_660,local_650[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    pRVar14 = (RobustnessTestCase *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&recoverScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_6b8 = local_6a8;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6b8,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_698 = local_688;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_698,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_668 = __lhs[1].field_2._M_allocated_capacity;
    local_678 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_674 = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_670 = (ShaderType)__lhs[1]._M_string_length;
    RStack_66c = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_6b8,local_6b0 + (long)local_6b8);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_698,local_690 + (long)local_698);
    local_fd0 = local_668;
    local_ff0[1]._4_4_ = CStack_674;
    local_ff0[1]._0_4_ = local_678;
    local_ff0[1]._12_4_ = RStack_66c;
    local_ff0[1]._8_4_ = SStack_670;
    anon_unknown_1::RobustnessTestCase::RobustnessTestCase
              (pRVar14,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    (pRVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__RobustnessTestCase_0211bb40;
    tcu::TestNode::addChild((TestNode *)local_fa8,(TestNode *)pRVar14);
    if (local_698 != local_688) {
      operator_delete(local_698,local_688[0] + 1);
    }
    pTVar11 = local_9d8;
    if (local_6b8 != local_6a8) {
      operator_delete(local_6b8,local_6a8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (__lhs[2].field_2._M_local_buf + 8);
    lVar19 = lVar19 + -1;
  } while (lVar19 != 0);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_f70);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_f78);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_f80);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_ec0);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_fa8);
  local_9e0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_9e0,eglTestCtx,"uniform_block","Uniform Block Accesses");
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"uniform_block","Uniform Block Accesses");
  local_f80 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f80,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_f78 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f78,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_a00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_a00,eglTestCtx,"local_array","Local array accesses");
  local_9f8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_9f8,eglTestCtx,"local_array","Local array accesses");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"uniform_block","Uniform Block Accesses");
  pTVar15 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar15,eglTestCtx,"uniform_block","Uniform Block Accesses");
  local_f70 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f70,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_fa8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fa8,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_9f0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_9f0,eglTestCtx,"local_array","Local array accesses");
  local_9e8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_9e8,eglTestCtx,"local_array","Local array accesses");
  local_ec0 = pTVar12;
  local_750 = pTVar11;
  local_748 = pTVar15;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_outOfBoundReadCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"vertex","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,"Provoke a context reset in vertex shader and ","");
      local_7f4 = ROBUSTACCESS_TRUE;
      local_7f8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_7fc = SHADERTYPE_VERT;
      local_800 = RESOURCETYPE_UBO;
      local_804 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases,(string *)local_1020,&local_fc8,
                 &local_7f4,&local_7f8,&local_7fc,&local_800,&local_804);
      local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa0,"fragment","");
      local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee8,"Provoke a context reset in fragment shader and ","");
      local_808 = ROBUSTACCESS_TRUE;
      local_80c = CONTEXTRESETTYPE_SHADER_OOB;
      local_810 = SHADERTYPE_FRAG;
      local_814 = RESOURCETYPE_UBO;
      local_818 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 1,&local_fa0,&local_ee8,&local_808,
                 &local_80c,&local_810,&local_814,&local_818);
      local_f08._M_dataplus._M_p = (pointer)&local_f08.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f08,"vertex_and_fragment","")
      ;
      local_f28._M_dataplus._M_p = (pointer)&local_f28.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f28,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_81c = ROBUSTACCESS_TRUE;
      local_820 = CONTEXTRESETTYPE_SHADER_OOB;
      local_824 = SHADERTYPE_VERT_AND_FRAG;
      local_828 = RESOURCETYPE_UBO;
      local_82c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 2,&local_f08,&local_f28,&local_81c,
                 &local_820,&local_824,&local_828,&local_82c);
      local_f48._M_dataplus._M_p = (pointer)&local_f48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f48,"compute","");
      local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f68,"Provoke a context reset in compute shader and ","");
      local_830 = ROBUSTACCESS_TRUE;
      local_834 = CONTEXTRESETTYPE_SHADER_OOB;
      local_838 = SHADERTYPE_COMPUTE;
      local_83c = RESOURCETYPE_UBO;
      local_840 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 3,&local_f48,&local_f68,&local_830,
                 &local_834,&local_838,&local_83c,&local_840);
      local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d98,"vertex","");
      local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db8,"Provoke a context reset in vertex shader and ","");
      local_844 = ROBUSTACCESS_TRUE;
      local_848 = CONTEXTRESETTYPE_SHADER_OOB;
      local_84c = SHADERTYPE_VERT;
      local_850 = RESOURCETYPE_SSBO;
      local_854 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 4,&local_d98,&local_db8,&local_844,
                 &local_848,&local_84c,&local_850,&local_854);
      local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd8,"fragment","");
      local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_df8,"Provoke a context reset in fragment shader and ","");
      local_858 = ROBUSTACCESS_TRUE;
      local_85c = CONTEXTRESETTYPE_SHADER_OOB;
      local_860 = SHADERTYPE_FRAG;
      local_864 = RESOURCETYPE_SSBO;
      local_868 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 5,&local_dd8,&local_df8,&local_858,
                 &local_85c,&local_860,&local_864,&local_868);
      local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e18,"vertex_and_fragment","")
      ;
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e38,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_86c = ROBUSTACCESS_TRUE;
      local_870 = CONTEXTRESETTYPE_SHADER_OOB;
      local_874 = SHADERTYPE_VERT_AND_FRAG;
      local_878 = RESOURCETYPE_SSBO;
      local_87c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 6,&local_e18,&local_e38,&local_86c,
                 &local_870,&local_874,&local_878,&local_87c);
      local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e58,"compute","");
      local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e78,"Provoke a context reset in compute shader and ","");
      local_880 = ROBUSTACCESS_TRUE;
      local_884 = CONTEXTRESETTYPE_SHADER_OOB;
      local_888 = SHADERTYPE_COMPUTE;
      local_88c = RESOURCETYPE_SSBO;
      local_890 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 7,&local_e58,&local_e78,&local_880,
                 &local_884,&local_888,&local_88c,&local_890);
      local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,"vertex","");
      local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d38,"Provoke a context reset in vertex shader and ","");
      local_894 = ROBUSTACCESS_TRUE;
      local_898 = CONTEXTRESETTYPE_SHADER_OOB;
      local_89c = SHADERTYPE_VERT;
      local_8a0 = RESOURCETYPE_LOCAL_ARRAY;
      local_8a4 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 8,&local_d18,&local_d38,&local_894,
                 &local_898,&local_89c,&local_8a0,&local_8a4);
      local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d58,"fragment","");
      local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d78,"Provoke a context reset in fragment shader and ","");
      local_8a8 = ROBUSTACCESS_TRUE;
      local_8ac = CONTEXTRESETTYPE_SHADER_OOB;
      local_8b0 = SHADERTYPE_FRAG;
      local_8b4 = RESOURCETYPE_LOCAL_ARRAY;
      local_8b8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 9,&local_d58,&local_d78,&local_8a8,
                 &local_8ac,&local_8b0,&local_8b4,&local_8b8);
      local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"vertex_and_fragment","")
      ;
      local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a58,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_8bc = ROBUSTACCESS_TRUE;
      local_8c0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8c4 = SHADERTYPE_VERT_AND_FRAG;
      local_8c8 = RESOURCETYPE_LOCAL_ARRAY;
      local_8cc = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 10,&local_a38,&local_a58,&local_8bc,
                 &local_8c0,&local_8c4,&local_8c8,&local_8cc);
      local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"compute","");
      local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a98,"Provoke a context reset in compute shader and ","");
      local_8d0 = ROBUSTACCESS_TRUE;
      local_8d4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8d8 = SHADERTYPE_COMPUTE;
      local_8dc = RESOURCETYPE_LOCAL_ARRAY;
      local_8e0 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xb,&local_a78,&local_a98,&local_8d0
                 ,&local_8d4,&local_8d8,&local_8dc,&local_8e0);
      local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"vertex","");
      local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ad8,"Provoke a context reset in vertex shader and ","");
      local_8e4 = ROBUSTACCESS_FALSE;
      local_8e8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8ec = SHADERTYPE_VERT;
      local_8f0 = RESOURCETYPE_UBO;
      local_8f4 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xc,&local_ab8,&local_ad8,&local_8e4
                 ,&local_8e8,&local_8ec,&local_8f0,&local_8f4);
      local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"fragment","");
      local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b18,"Provoke a context reset in fragment shader and ","");
      local_8f8 = ROBUSTACCESS_FALSE;
      local_8fc = CONTEXTRESETTYPE_SHADER_OOB;
      local_900 = SHADERTYPE_FRAG;
      local_904 = RESOURCETYPE_UBO;
      local_908 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xd,&local_af8,&local_b18,&local_8f8
                 ,&local_8fc,&local_900,&local_904,&local_908);
      local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"vertex_and_fragment","")
      ;
      local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b58,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_90c = ROBUSTACCESS_FALSE;
      local_910 = CONTEXTRESETTYPE_SHADER_OOB;
      local_914 = SHADERTYPE_VERT_AND_FRAG;
      local_918 = RESOURCETYPE_UBO;
      local_91c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xe,&local_b38,&local_b58,&local_90c
                 ,&local_910,&local_914,&local_918,&local_91c);
      local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"compute","");
      local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b98,"Provoke a context reset in compute shader and ","");
      local_920 = ROBUSTACCESS_FALSE;
      local_924 = CONTEXTRESETTYPE_SHADER_OOB;
      local_928 = SHADERTYPE_COMPUTE;
      local_92c = RESOURCETYPE_UBO;
      local_930 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xf,&local_b78,&local_b98,&local_920
                 ,&local_924,&local_928,&local_92c,&local_930);
      local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb8,"vertex","");
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd8,"Provoke a context reset in vertex shader and ","");
      local_934 = ROBUSTACCESS_FALSE;
      local_938 = CONTEXTRESETTYPE_SHADER_OOB;
      local_93c = SHADERTYPE_VERT;
      local_940 = RESOURCETYPE_SSBO;
      local_944 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x10,&local_bb8,&local_bd8,
                 &local_934,&local_938,&local_93c,&local_940,&local_944);
      local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf8,"fragment","");
      local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c18,"Provoke a context reset in fragment shader and ","");
      local_948 = ROBUSTACCESS_FALSE;
      local_94c = CONTEXTRESETTYPE_SHADER_OOB;
      local_950 = SHADERTYPE_FRAG;
      local_954 = RESOURCETYPE_SSBO;
      local_958 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x11,&local_bf8,&local_c18,
                 &local_948,&local_94c,&local_950,&local_954,&local_958);
      local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"vertex_and_fragment","")
      ;
      local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c58,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_95c = ROBUSTACCESS_FALSE;
      local_960 = CONTEXTRESETTYPE_SHADER_OOB;
      local_964 = SHADERTYPE_VERT_AND_FRAG;
      local_968 = RESOURCETYPE_SSBO;
      local_96c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x12,&local_c38,&local_c58,
                 &local_95c,&local_960,&local_964,&local_968,&local_96c);
      local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"compute","");
      local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c98,"Provoke a context reset in compute shader and ","");
      local_970 = ROBUSTACCESS_FALSE;
      local_974 = CONTEXTRESETTYPE_SHADER_OOB;
      local_978 = SHADERTYPE_COMPUTE;
      local_97c = RESOURCETYPE_SSBO;
      local_980 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x13,&local_c78,&local_c98,
                 &local_970,&local_974,&local_978,&local_97c,&local_980);
      local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"vertex","");
      local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cd8,"Provoke a context reset in vertex shader and ","");
      local_984 = ROBUSTACCESS_FALSE;
      local_988 = CONTEXTRESETTYPE_SHADER_OOB;
      local_98c = SHADERTYPE_VERT;
      local_990 = RESOURCETYPE_LOCAL_ARRAY;
      local_994 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x14,&local_cb8,&local_cd8,
                 &local_984,&local_988,&local_98c,&local_990,&local_994);
      local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf8,"fragment","");
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_770,"Provoke a context reset in fragment shader and ","");
      local_998 = ROBUSTACCESS_FALSE;
      local_99c = CONTEXTRESETTYPE_SHADER_OOB;
      local_9a0 = SHADERTYPE_FRAG;
      local_9a4 = RESOURCETYPE_LOCAL_ARRAY;
      local_9a8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x15,&local_cf8,&local_770,
                 &local_998,&local_99c,&local_9a0,&local_9a4,&local_9a8);
      local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"vertex_and_fragment","")
      ;
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7b0,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_9ac = ROBUSTACCESS_FALSE;
      local_9b0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9b4 = SHADERTYPE_VERT_AND_FRAG;
      local_9b8 = RESOURCETYPE_LOCAL_ARRAY;
      local_9bc = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x16,&local_790,&local_7b0,
                 &local_9ac,&local_9b0,&local_9b4,&local_9b8,&local_9bc);
      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"compute","");
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7f0,"Provoke a context reset in compute shader and ","");
      local_9c0 = ROBUSTACCESS_FALSE;
      local_9c4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9c8 = SHADERTYPE_COMPUTE;
      local_9cc = RESOURCETYPE_LOCAL_ARRAY;
      local_9d0 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x17,&local_7d0,&local_7f0,
                 &local_9c0,&local_9c4,&local_9c8,&local_9cc,&local_9d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
        operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_790._M_dataplus._M_p != &local_790.field_2) {
        operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
        operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
        operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
        operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
        operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
        operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
        operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
        operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
        operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
        operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
        operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
        operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
        operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
        operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
        operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
        operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
        operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
        operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
        operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
        operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
        operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
        operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
        operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
        operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
        operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
        operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
        operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
        operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
        operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
        operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
        operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
        operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
        operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
        operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
        operator_delete(local_f48._M_dataplus._M_p,local_f48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f28._M_dataplus._M_p != &local_f28.field_2) {
        operator_delete(local_f28._M_dataplus._M_p,local_f28.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f08._M_dataplus._M_p != &local_f08.field_2) {
        operator_delete(local_f08._M_dataplus._M_p,local_f08.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
        operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
        operator_delete(local_fa0._M_dataplus._M_p,local_fa0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor_49,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases)
      ;
    }
  }
  lVar19 = 0;
  do {
    iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar19
                     );
    if (iVar10 == 0) {
      piVar17 = (int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                       lVar19);
      iVar10 = *piVar17;
      if (iVar10 == 0) {
        pTVar13 = (TestNode *)operator_new(0xf8);
        pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar19),&resetScenarioDescription);
        uVar8 = local_1020._0_8_;
        local_e0._0_8_ = local_e0 + 0x10;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                    _M_string_length + lVar19) + lVar5);
        local_c0._M_p = (pointer)local_b0;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                 _M_dataplus._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                    _M_string_length + lVar19) + lVar5);
        local_90 = *(undefined8 *)
                    ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar19
                    );
        local_b0[1]._0_4_ = piVar17[0];
        local_b0[1]._4_4_ = piVar17[1];
        local_b0[1]._8_8_ =
             *(undefined8 *)
              ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar19);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_e0);
        tcu::TestNode::addChild((TestNode *)local_9e0,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != local_b0) {
          operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
        }
        if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
          operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
        }
        iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType +
                         lVar19);
        if (iVar10 != 0) goto LAB_00e418ed;
        iVar10 = *piVar17;
      }
      if (iVar10 == 1) {
        pTVar13 = (TestNode *)operator_new(0xf8);
        pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar19),&resetScenarioDescription);
        uVar8 = local_1020._0_8_;
        local_138._0_8_ = local_138 + 0x10;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                    _M_string_length + lVar19) + lVar5);
        local_118._M_p = (pointer)local_108;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                 _M_dataplus._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                    _M_string_length + lVar19) + lVar5);
        local_e8 = *(undefined8 *)
                    ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar19
                    );
        local_108[1]._0_4_ = piVar17[0];
        local_108[1]._4_4_ = piVar17[1];
        local_108[1]._8_8_ =
             *(undefined8 *)
              ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar19);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_138);
        tcu::TestNode::addChild((TestNode *)local_ec0,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_p != local_108) {
          operator_delete(local_118._M_p,local_108[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
          operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
        }
        iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType +
                         lVar19);
        goto LAB_00e418ed;
      }
    }
    else {
LAB_00e418ed:
      if (iVar10 == 1) {
        piVar17 = (int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType
                         + lVar19);
        if (*piVar17 == 0) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                     _M_dataplus._M_p + lVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                 _M_dataplus._M_p + lVar19),&resetScenarioDescription);
          uVar8 = local_1020._0_8_;
          local_190._0_8_ = local_190 + 0x10;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_190,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                      _M_string_length + lVar19) + lVar5);
          local_170._M_p = (pointer)local_160;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                      _M_string_length + lVar19) + lVar5);
          local_140 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType +
                       lVar19);
          local_160[1]._0_4_ = piVar17[0];
          local_160[1]._4_4_ = piVar17[1];
          local_160[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_190);
          tcu::TestNode::addChild((TestNode *)local_f78,pTVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_p != local_160) {
            operator_delete(local_170._M_p,local_160[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
          iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType +
                           lVar19);
          if (iVar10 != 1) goto LAB_00e41b8d;
        }
        if (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                    lVar19) != 1) goto LAB_00e41f83;
        pTVar13 = (TestNode *)operator_new(0xf8);
        pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar19),&resetScenarioDescription);
        uVar8 = local_1020._0_8_;
        local_1e8._0_8_ = local_1e8 + 0x10;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e8,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                    _M_string_length + lVar19) + lVar5);
        local_1c8._M_p = (pointer)local_1b8;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                 _M_dataplus._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                    _M_string_length + lVar19) + lVar5);
        local_198 = *(undefined8 *)
                     ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType +
                     lVar19);
        local_1b8[1]._0_4_ = piVar17[0];
        local_1b8[1]._4_4_ = piVar17[1];
        local_1b8[1]._8_8_ =
             *(undefined8 *)
              ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar19);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_1e8);
        tcu::TestNode::addChild((TestNode *)local_fa8,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_p != local_1b8) {
          operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
          operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
        }
        iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType +
                         lVar19);
      }
LAB_00e41b8d:
      if (iVar10 == 2) {
        piVar17 = (int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType
                         + lVar19);
        if (*piVar17 == 0) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                     _M_dataplus._M_p + lVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                 _M_dataplus._M_p + lVar19),&resetScenarioDescription);
          uVar8 = local_1020._0_8_;
          local_240._0_8_ = local_240 + 0x10;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_240,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                      _M_string_length + lVar19) + lVar5);
          local_220._M_p = (pointer)local_210;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                      _M_string_length + lVar19) + lVar5);
          local_1f0 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType +
                       lVar19);
          local_210[1]._0_4_ = piVar17[0];
          local_210[1]._4_4_ = piVar17[1];
          local_210[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_240);
          tcu::TestNode::addChild((TestNode *)local_9f8,pTVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_p != local_210) {
            operator_delete(local_220._M_p,local_210[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
            operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
          if (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType +
                      lVar19) != 2) goto LAB_00e41f83;
        }
        if (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                    lVar19) == 1) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                     _M_dataplus._M_p + lVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                 _M_dataplus._M_p + lVar19),&resetScenarioDescription);
          uVar8 = local_1020._0_8_;
          local_298._0_8_ = local_298 + 0x10;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_298,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                      _M_string_length + lVar19) + lVar5);
          local_278._M_p = (pointer)local_268;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                      _M_string_length + lVar19) + lVar5);
          local_248 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType +
                       lVar19);
          local_268[1]._0_4_ = piVar17[0];
          local_268[1]._4_4_ = piVar17[1];
          local_268[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_298);
          tcu::TestNode::addChild((TestNode *)local_9e8,pTVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_p != local_268) {
            operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
        }
      }
    }
LAB_00e41f83:
    lVar19 = lVar19 + 0x58;
  } while (lVar19 != 0x840);
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_outOfBoundWriteCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"vertex","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,"Provoke a context reset in vertex shader and ","");
      local_7f4 = ROBUSTACCESS_TRUE;
      local_7f8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_7fc = SHADERTYPE_VERT;
      local_800 = RESOURCETYPE_UBO;
      local_804 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases,(string *)local_1020,&local_fc8,
                 &local_7f4,&local_7f8,&local_7fc,&local_800,&local_804);
      local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa0,"fragment","");
      local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee8,"Provoke a context reset in fragment shader and ","");
      local_808 = ROBUSTACCESS_TRUE;
      local_80c = CONTEXTRESETTYPE_SHADER_OOB;
      local_810 = SHADERTYPE_FRAG;
      local_814 = RESOURCETYPE_UBO;
      local_818 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 1,&local_fa0,&local_ee8,&local_808,
                 &local_80c,&local_810,&local_814,&local_818);
      local_f08._M_dataplus._M_p = (pointer)&local_f08.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f08,"vertex_and_fragment","")
      ;
      local_f28._M_dataplus._M_p = (pointer)&local_f28.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f28,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_81c = ROBUSTACCESS_TRUE;
      local_820 = CONTEXTRESETTYPE_SHADER_OOB;
      local_824 = SHADERTYPE_VERT_AND_FRAG;
      local_828 = RESOURCETYPE_UBO;
      local_82c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 2,&local_f08,&local_f28,&local_81c,
                 &local_820,&local_824,&local_828,&local_82c);
      local_f48._M_dataplus._M_p = (pointer)&local_f48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f48,"compute","");
      local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f68,"Provoke a context reset in compute shader and ","");
      local_830 = ROBUSTACCESS_TRUE;
      local_834 = CONTEXTRESETTYPE_SHADER_OOB;
      local_838 = SHADERTYPE_COMPUTE;
      local_83c = RESOURCETYPE_UBO;
      local_840 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 3,&local_f48,&local_f68,&local_830,
                 &local_834,&local_838,&local_83c,&local_840);
      local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d98,"vertex","");
      local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db8,"Provoke a context reset in vertex shader and ","");
      local_844 = ROBUSTACCESS_TRUE;
      local_848 = CONTEXTRESETTYPE_SHADER_OOB;
      local_84c = SHADERTYPE_VERT;
      local_850 = RESOURCETYPE_SSBO;
      local_854 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 4,&local_d98,&local_db8,&local_844,
                 &local_848,&local_84c,&local_850,&local_854);
      local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd8,"fragment","");
      local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_df8,"Provoke a context reset in fragment shader and ","");
      local_858 = ROBUSTACCESS_TRUE;
      local_85c = CONTEXTRESETTYPE_SHADER_OOB;
      local_860 = SHADERTYPE_FRAG;
      local_864 = RESOURCETYPE_SSBO;
      local_868 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 5,&local_dd8,&local_df8,&local_858,
                 &local_85c,&local_860,&local_864,&local_868);
      local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e18,"vertex_and_fragment","")
      ;
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e38,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_86c = ROBUSTACCESS_TRUE;
      local_870 = CONTEXTRESETTYPE_SHADER_OOB;
      local_874 = SHADERTYPE_VERT_AND_FRAG;
      local_878 = RESOURCETYPE_SSBO;
      local_87c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 6,&local_e18,&local_e38,&local_86c,
                 &local_870,&local_874,&local_878,&local_87c);
      local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e58,"compute","");
      local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e78,"Provoke a context reset in compute shader and ","");
      local_880 = ROBUSTACCESS_TRUE;
      local_884 = CONTEXTRESETTYPE_SHADER_OOB;
      local_888 = SHADERTYPE_COMPUTE;
      local_88c = RESOURCETYPE_SSBO;
      local_890 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 7,&local_e58,&local_e78,&local_880,
                 &local_884,&local_888,&local_88c,&local_890);
      local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,"vertex","");
      local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d38,"Provoke a context reset in vertex shader and ","");
      local_894 = ROBUSTACCESS_TRUE;
      local_898 = CONTEXTRESETTYPE_SHADER_OOB;
      local_89c = SHADERTYPE_VERT;
      local_8a0 = RESOURCETYPE_LOCAL_ARRAY;
      local_8a4 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 8,&local_d18,&local_d38,&local_894,
                 &local_898,&local_89c,&local_8a0,&local_8a4);
      local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d58,"fragment","");
      local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d78,"Provoke a context reset in fragment shader and ","");
      local_8a8 = ROBUSTACCESS_TRUE;
      local_8ac = CONTEXTRESETTYPE_SHADER_OOB;
      local_8b0 = SHADERTYPE_FRAG;
      local_8b4 = RESOURCETYPE_LOCAL_ARRAY;
      local_8b8 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 9,&local_d58,&local_d78,&local_8a8,
                 &local_8ac,&local_8b0,&local_8b4,&local_8b8);
      local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"vertex_and_fragment","")
      ;
      local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a58,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_8bc = ROBUSTACCESS_TRUE;
      local_8c0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8c4 = SHADERTYPE_VERT_AND_FRAG;
      local_8c8 = RESOURCETYPE_LOCAL_ARRAY;
      local_8cc = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 10,&local_a38,&local_a58,&local_8bc
                 ,&local_8c0,&local_8c4,&local_8c8,&local_8cc);
      local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"compute","");
      local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a98,"Provoke a context reset in compute shader and ","");
      local_8d0 = ROBUSTACCESS_TRUE;
      local_8d4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8d8 = SHADERTYPE_COMPUTE;
      local_8dc = RESOURCETYPE_LOCAL_ARRAY;
      local_8e0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xb,&local_a78,&local_a98,
                 &local_8d0,&local_8d4,&local_8d8,&local_8dc,&local_8e0);
      local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"vertex","");
      local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ad8,"Provoke a context reset in vertex shader and ","");
      local_8e4 = ROBUSTACCESS_FALSE;
      local_8e8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8ec = SHADERTYPE_VERT;
      local_8f0 = RESOURCETYPE_UBO;
      local_8f4 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xc,&local_ab8,&local_ad8,
                 &local_8e4,&local_8e8,&local_8ec,&local_8f0,&local_8f4);
      local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"fragment","");
      local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b18,"Provoke a context reset in fragment shader and ","");
      local_8f8 = ROBUSTACCESS_FALSE;
      local_8fc = CONTEXTRESETTYPE_SHADER_OOB;
      local_900 = SHADERTYPE_FRAG;
      local_904 = RESOURCETYPE_UBO;
      local_908 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xd,&local_af8,&local_b18,
                 &local_8f8,&local_8fc,&local_900,&local_904,&local_908);
      local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"vertex_and_fragment","")
      ;
      local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b58,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_90c = ROBUSTACCESS_FALSE;
      local_910 = CONTEXTRESETTYPE_SHADER_OOB;
      local_914 = SHADERTYPE_VERT_AND_FRAG;
      local_918 = RESOURCETYPE_UBO;
      local_91c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xe,&local_b38,&local_b58,
                 &local_90c,&local_910,&local_914,&local_918,&local_91c);
      local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"compute","");
      local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b98,"Provoke a context reset in compute shader and ","");
      local_920 = ROBUSTACCESS_FALSE;
      local_924 = CONTEXTRESETTYPE_SHADER_OOB;
      local_928 = SHADERTYPE_COMPUTE;
      local_92c = RESOURCETYPE_UBO;
      local_930 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xf,&local_b78,&local_b98,
                 &local_920,&local_924,&local_928,&local_92c,&local_930);
      local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb8,"vertex","");
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd8,"Provoke a context reset in vertex shader and ","");
      local_934 = ROBUSTACCESS_FALSE;
      local_938 = CONTEXTRESETTYPE_SHADER_OOB;
      local_93c = SHADERTYPE_VERT;
      local_940 = RESOURCETYPE_SSBO;
      local_944 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x10,&local_bb8,&local_bd8,
                 &local_934,&local_938,&local_93c,&local_940,&local_944);
      local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf8,"fragment","");
      local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c18,"Provoke a context reset in fragment shader and ","");
      local_948 = ROBUSTACCESS_FALSE;
      local_94c = CONTEXTRESETTYPE_SHADER_OOB;
      local_950 = SHADERTYPE_FRAG;
      local_954 = RESOURCETYPE_SSBO;
      local_958 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x11,&local_bf8,&local_c18,
                 &local_948,&local_94c,&local_950,&local_954,&local_958);
      local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"vertex_and_fragment","")
      ;
      local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c58,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_95c = ROBUSTACCESS_FALSE;
      local_960 = CONTEXTRESETTYPE_SHADER_OOB;
      local_964 = SHADERTYPE_VERT_AND_FRAG;
      local_968 = RESOURCETYPE_SSBO;
      local_96c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x12,&local_c38,&local_c58,
                 &local_95c,&local_960,&local_964,&local_968,&local_96c);
      local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"compute","");
      local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c98,"Provoke a context reset in compute shader and ","");
      local_970 = ROBUSTACCESS_FALSE;
      local_974 = CONTEXTRESETTYPE_SHADER_OOB;
      local_978 = SHADERTYPE_COMPUTE;
      local_97c = RESOURCETYPE_SSBO;
      local_980 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x13,&local_c78,&local_c98,
                 &local_970,&local_974,&local_978,&local_97c,&local_980);
      local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"vertex","");
      local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cd8,"Provoke a context reset in vertex shader and ","");
      local_984 = ROBUSTACCESS_FALSE;
      local_988 = CONTEXTRESETTYPE_SHADER_OOB;
      local_98c = SHADERTYPE_VERT;
      local_990 = RESOURCETYPE_LOCAL_ARRAY;
      local_994 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x14,&local_cb8,&local_cd8,
                 &local_984,&local_988,&local_98c,&local_990,&local_994);
      local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf8,"fragment","");
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_770,"Provoke a context reset in fragment shader and ","");
      local_998 = ROBUSTACCESS_FALSE;
      local_99c = CONTEXTRESETTYPE_SHADER_OOB;
      local_9a0 = SHADERTYPE_FRAG;
      local_9a4 = RESOURCETYPE_LOCAL_ARRAY;
      local_9a8 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x15,&local_cf8,&local_770,
                 &local_998,&local_99c,&local_9a0,&local_9a4,&local_9a8);
      local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"vertex_and_fragment","")
      ;
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7b0,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_9ac = ROBUSTACCESS_FALSE;
      local_9b0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9b4 = SHADERTYPE_VERT_AND_FRAG;
      local_9b8 = RESOURCETYPE_LOCAL_ARRAY;
      local_9bc = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x16,&local_790,&local_7b0,
                 &local_9ac,&local_9b0,&local_9b4,&local_9b8,&local_9bc);
      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"compute","");
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7f0,"Provoke a context reset in compute shader and ","");
      local_9c0 = ROBUSTACCESS_FALSE;
      local_9c4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9c8 = SHADERTYPE_COMPUTE;
      local_9cc = RESOURCETYPE_LOCAL_ARRAY;
      local_9d0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x17,&local_7d0,&local_7f0,
                 &local_9c0,&local_9c4,&local_9c8,&local_9cc,&local_9d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
        operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_790._M_dataplus._M_p != &local_790.field_2) {
        operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
        operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
        operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
        operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
        operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
        operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
        operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
        operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
        operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
        operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
        operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
        operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
        operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
        operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
        operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
        operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
        operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
        operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
        operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
        operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
        operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
        operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
        operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
        operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
        operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
        operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
        operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
        operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
        operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
        operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
        operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
        operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
        operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
        operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
        operator_delete(local_f48._M_dataplus._M_p,local_f48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f28._M_dataplus._M_p != &local_f28.field_2) {
        operator_delete(local_f28._M_dataplus._M_p,local_f28.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f08._M_dataplus._M_p != &local_f08.field_2) {
        operator_delete(local_f08._M_dataplus._M_p,local_f08.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
        operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
        operator_delete(local_fa0._M_dataplus._M_p,local_fa0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor_50,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases
                         );
    }
  }
  lVar19 = 0;
  do {
    iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType +
                     lVar19);
    if (iVar10 == 0) {
      piVar17 = (int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType +
                       lVar19);
      iVar10 = *piVar17;
      if (iVar10 == 0) {
        pTVar13 = (TestNode *)operator_new(0xf8);
        pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar19),&resetScenarioDescription);
        uVar8 = local_1020._0_8_;
        local_2f0._0_8_ = local_2f0 + 0x10;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f0,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                    _M_string_length + lVar19) + lVar5);
        local_2d0._M_p = (pointer)local_2c0;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                 _M_dataplus._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                    _M_string_length + lVar19) + lVar5);
        local_2a0 = *(undefined8 *)
                     ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType +
                     lVar19);
        local_2c0[1]._0_4_ = piVar17[0];
        local_2c0[1]._4_4_ = piVar17[1];
        local_2c0[1]._8_8_ =
             *(undefined8 *)
              ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar19);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_2f0);
        tcu::TestNode::addChild((TestNode *)local_750,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_p != local_2c0) {
          operator_delete(local_2d0._M_p,local_2c0[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
          operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
        }
        iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType +
                         lVar19);
        if (iVar10 != 0) goto LAB_00e4210a;
        iVar10 = *piVar17;
      }
      if (iVar10 == 1) {
        pTVar13 = (TestNode *)operator_new(0xf8);
        pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar19),&resetScenarioDescription);
        uVar8 = local_1020._0_8_;
        local_348._0_8_ = local_348 + 0x10;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_348,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                    _M_string_length + lVar19) + lVar5);
        local_328._M_p = (pointer)local_318;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                 _M_dataplus._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                    _M_string_length + lVar19) + lVar5);
        local_2f8 = *(undefined8 *)
                     ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType +
                     lVar19);
        local_318[1]._0_4_ = piVar17[0];
        local_318[1]._4_4_ = piVar17[1];
        local_318[1]._8_8_ =
             *(undefined8 *)
              ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar19);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_348);
        tcu::TestNode::addChild((TestNode *)local_748,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_p != local_318) {
          operator_delete(local_328._M_p,local_318[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
          operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
        }
        if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
          operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
        }
        iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType +
                         lVar19);
        goto LAB_00e4210a;
      }
    }
    else {
LAB_00e4210a:
      if (iVar10 == 1) {
        piVar17 = (int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType
                         + lVar19);
        if (*piVar17 == 0) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                     _M_dataplus._M_p + lVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                 _M_dataplus._M_p + lVar19),&resetScenarioDescription);
          uVar8 = local_1020._0_8_;
          local_3a0._0_8_ = local_3a0 + 0x10;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                      _M_string_length + lVar19) + lVar5);
          local_380._M_p = (pointer)local_370;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_380,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description
                                      ._M_string_length + lVar19) + lVar5);
          local_350 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType +
                       lVar19);
          local_370[1]._0_4_ = piVar17[0];
          local_370[1]._4_4_ = piVar17[1];
          local_370[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_3a0);
          tcu::TestNode::addChild((TestNode *)local_f80,pTVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_p != local_370) {
            operator_delete(local_380._M_p,local_370[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
            operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
          iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType +
                           lVar19);
          if (iVar10 != 1) goto LAB_00e423aa;
        }
        if (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType +
                    lVar19) != 1) goto LAB_00e427a0;
        pTVar13 = (TestNode *)operator_new(0xf8);
        pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar19),&resetScenarioDescription);
        uVar8 = local_1020._0_8_;
        local_3f8._0_8_ = local_3f8 + 0x10;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f8,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                    _M_string_length + lVar19) + lVar5);
        local_3d8._M_p = (pointer)local_3c8;
        lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                 _M_dataplus._M_p + lVar19);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d8,lVar5,
                   *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                    _M_string_length + lVar19) + lVar5);
        local_3a8 = *(undefined8 *)
                     ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType +
                     lVar19);
        local_3c8[1]._0_4_ = piVar17[0];
        local_3c8[1]._4_4_ = piVar17[1];
        local_3c8[1]._8_8_ =
             *(undefined8 *)
              ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar19);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_3f8);
        tcu::TestNode::addChild((TestNode *)local_f70,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_p != local_3c8) {
          operator_delete(local_3d8._M_p,local_3c8[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
          operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
        }
        if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
          operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
        }
        iVar10 = *(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType +
                         lVar19);
      }
LAB_00e423aa:
      if (iVar10 == 2) {
        piVar17 = (int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType
                         + lVar19);
        if (*piVar17 == 0) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                     _M_dataplus._M_p + lVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                 _M_dataplus._M_p + lVar19),&resetScenarioDescription);
          uVar8 = local_1020._0_8_;
          local_450._0_8_ = local_450 + 0x10;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_450,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                      _M_string_length + lVar19) + lVar5);
          local_430._M_p = (pointer)local_420;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_430,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description
                                      ._M_string_length + lVar19) + lVar5);
          local_400 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType +
                       lVar19);
          local_420[1]._0_4_ = piVar17[0];
          local_420[1]._4_4_ = piVar17[1];
          local_420[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_450);
          tcu::TestNode::addChild((TestNode *)local_a00,pTVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_p != local_420) {
            operator_delete(local_430._M_p,local_420[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
            operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
          if (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType +
                      lVar19) != 2) goto LAB_00e427a0;
        }
        if (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType +
                    lVar19) == 1) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                     _M_dataplus._M_p + lVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                 _M_dataplus._M_p + lVar19),&resetScenarioDescription);
          uVar8 = local_1020._0_8_;
          local_4a8._0_8_ = local_4a8 + 0x10;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4a8,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                      _M_string_length + lVar19) + lVar5);
          local_488._M_p = (pointer)local_478;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                   _M_dataplus._M_p + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_488,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description
                                      ._M_string_length + lVar19) + lVar5);
          local_458 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType +
                       lVar19);
          local_478[1]._0_4_ = piVar17[0];
          local_478[1]._4_4_ = piVar17[1];
          local_478[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_4a8);
          tcu::TestNode::addChild((TestNode *)local_9f0,pTVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_p != local_478) {
            operator_delete(local_488._M_p,local_478[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
            operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
        }
      }
    }
LAB_00e427a0:
    lVar19 = lVar19 + 0x58;
    if (lVar19 == 0x840) {
      pTVar12 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"reads","Out of bounds read accesses");
      pTVar11 = local_750;
      pTVar15 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar15,eglTestCtx,"writes","Out of bounds write accesses");
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_9e0);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f78);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_9f8);
      tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)pTVar11);
      tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)local_f80);
      tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)local_a00);
      pTVar11 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar11,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)pTVar12);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)pTVar15);
      tcu::TestNode::addChild((TestNode *)local_a08,(TestNode *)pTVar11);
      pTVar11 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"reads","Out of bounds read accesses");
      pTVar12 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"writes","Out of bounds write accesses");
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_ec0);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_fa8);
      tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_9e8);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_748);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f70);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_9f0);
      pTVar15 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar15,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)pTVar11);
      tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)pTVar12);
      tcu::TestNode::addChild((TestNode *)local_a10,(TestNode *)pTVar15);
      pTVar11 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar11,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      pTVar12 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar12,eglTestCtx,"reset_status",
                 "Tests that query the reset status after a context reset has occurred");
      local_fa8 = pTVar11;
      if (createRobustnessTests(deqp::egl::EglTestContext&)::s_fixedFunctionPipelineCases == '\0') {
        iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                      s_fixedFunctionPipelineCases);
        if (iVar10 != 0) {
          local_1020._0_8_ = local_1020 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1020,"index_buffer_out_of_bounds","");
          local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_fc8,
                     "Provoke context reset and query error states and reset notifications","");
          local_d98._M_dataplus._M_p = local_d98._M_dataplus._M_p & 0xffffffff00000000;
          local_db8._M_dataplus._M_p._0_4_ = 2;
          local_dd8._M_dataplus._M_p = local_dd8._M_dataplus._M_p & 0xffffffff00000000;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases,(string *)local_1020,
                     &local_fc8,(RobustAccessType *)&local_d98,(ContextResetType *)&local_db8,
                     (FixedFunctionType *)&local_dd8);
          local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_fa0,"vertex_buffer_out_of_bounds","");
          local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_ee8,
                     "Provoke context reset and query error states and reset notifications","");
          local_df8._M_dataplus._M_p = local_df8._M_dataplus._M_p & 0xffffffff00000000;
          local_e18._M_dataplus._M_p._0_4_ = 2;
          local_e38._M_dataplus._M_p._0_4_ = 1;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases + 1,&local_fa0,&local_ee8,
                     (RobustAccessType *)&local_df8,(ContextResetType *)&local_e18,
                     (FixedFunctionType *)&local_e38);
          local_f08._M_dataplus._M_p = (pointer)&local_f08.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f08,"index_buffer_out_of_bounds","");
          local_f28._M_dataplus._M_p = (pointer)&local_f28.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f28,
                     "Provoke context reset and query error states and reset notifications","");
          local_e58._M_dataplus._M_p._0_4_ = 1;
          local_e78._M_dataplus._M_p._0_4_ = 2;
          local_d18._M_dataplus._M_p = local_d18._M_dataplus._M_p & 0xffffffff00000000;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases + 2,&local_f08,&local_f28,
                     (RobustAccessType *)&local_e58,(ContextResetType *)&local_e78,
                     (FixedFunctionType *)&local_d18);
          local_f48._M_dataplus._M_p = (pointer)&local_f48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f48,"vertex_buffer_out_of_bounds","");
          local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f68,
                     "Provoke context reset and query error states and reset notifications","");
          local_d38._M_dataplus._M_p._0_4_ = 1;
          local_d58._M_dataplus._M_p._0_4_ = 2;
          local_d78._M_dataplus._M_p._0_4_ = 1;
          anon_unknown_1::RobustnessTestCase::Params::Params
                    (createRobustnessTests::s_fixedFunctionPipelineCases + 3,&local_f48,&local_f68,
                     (RobustAccessType *)&local_d38,(ContextResetType *)&local_d58,
                     (FixedFunctionType *)&local_d78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
            operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
            operator_delete(local_f48._M_dataplus._M_p,local_f48.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f28._M_dataplus._M_p != &local_f28.field_2) {
            operator_delete(local_f28._M_dataplus._M_p,local_f28.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f08._M_dataplus._M_p != &local_f08.field_2) {
            operator_delete(local_f08._M_dataplus._M_p,local_f08.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
            operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
            operator_delete(local_fa0._M_dataplus._M_p,local_fa0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
            operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
            operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
          }
          __cxa_atexit(__cxx_global_array_dtor_58,0,&__dso_handle);
          __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::
                               s_fixedFunctionPipelineCases);
        }
      }
      lVar19 = 0x40;
      do {
        puVar2 = (undefined8 *)
                 ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name._M_dataplus.
                         _M_p + lVar19);
        if (*(int *)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.
                            _M_dataplus._M_p + lVar19) == 0) {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                     m_description._M_string_length + lVar19);
          pcVar6 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                     m_shaderType + lVar19);
          local_500._0_8_ = local_500 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar3,
                     pcVar3 + *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                               m_description.field_2 + lVar19));
          local_4e0._M_p = (pointer)local_4d0;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_shaderType
                           + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                      m_readWriteType + lVar19) + lVar5);
          local_4b0 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.field_2
                       + lVar19);
          local_4d0[1]._0_8_ = *puVar2;
          local_4d0[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.
                        _M_string_length + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,pcVar6,(Params *)local_500);
          tcu::TestNode::addChild((TestNode *)local_fa8,pTVar13);
          pTVar15 = local_740;
          pTVar11 = local_9d8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_p != local_4d0) {
            operator_delete(local_4e0._M_p,local_4d0[0]._M_allocated_capacity + 1);
          }
          puVar7 = local_500;
          plVar18 = (long *)local_500._0_8_;
        }
        else {
          pTVar13 = (TestNode *)operator_new(0xf8);
          pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                     m_description._M_string_length + lVar19);
          pcVar6 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                     m_shaderType + lVar19);
          local_558._0_8_ = local_558 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_558,pcVar3,
                     pcVar3 + *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                               m_description.field_2 + lVar19));
          local_538._M_p = (pointer)local_528;
          lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_shaderType
                           + lVar19);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,lVar5,
                     *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                      m_readWriteType + lVar19) + lVar5);
          local_508 = *(undefined8 *)
                       ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.field_2
                       + lVar19);
          local_528[1]._0_8_ = *puVar2;
          local_528[1]._8_8_ =
               *(undefined8 *)
                ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.
                        _M_string_length + lVar19);
          anon_unknown_1::BasicResetCase::BasicResetCase
                    ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,pcVar6,(Params *)local_558);
          tcu::TestNode::addChild((TestNode *)pTVar12,pTVar13);
          pTVar15 = local_740;
          pTVar11 = local_9d8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_p != local_528) {
            operator_delete(local_538._M_p,local_528[0]._M_allocated_capacity + 1);
          }
          puVar7 = local_558;
          plVar18 = (long *)local_558._0_8_;
        }
        if (plVar18 != (long *)(puVar7 + 0x10)) {
          operator_delete(plVar18,*(long *)(puVar7 + 0x10) + 1);
        }
        lVar19 = lVar19 + 0x58;
      } while (lVar19 != 0x1a0);
      tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)local_fa8);
      tcu::TestNode::addChild((TestNode *)local_a18,(TestNode *)pTVar12);
      pTVar16 = (TestCase *)operator_new(0xf8);
      TestCase::TestCase(pTVar16,eglTestCtx,"query_robust_access",
                         "Query robust access after successfully creating a robust context");
      pTVar16[1].super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&pTVar16[1].super_TestCase.super_TestNode.m_name;
      pTVar16[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)&pTVar16[1].super_TestCase.super_TestNode.m_description;
      *(undefined8 *)((long)&pTVar16[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar16[1].m_eglTestCtx = (EglTestContext *)0x0;
      *(undefined4 *)&pTVar16[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
      (pTVar16->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_0211bb90;
      tcu::TestNode::addChild((TestNode *)local_ea8,(TestNode *)pTVar16);
      pTVar16 = (TestCase *)operator_new(0xf8);
      TestCase::TestCase(pTVar16,eglTestCtx,"no_reset_notification",
                         "Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION"
                        );
      pTVar16[1].super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&pTVar16[1].super_TestCase.super_TestNode.m_name;
      pTVar16[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)&pTVar16[1].super_TestCase.super_TestNode.m_description;
      *(undefined8 *)((long)&pTVar16[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar16[1].m_eglTestCtx = (EglTestContext *)0x0;
      *(undefined4 *)&pTVar16[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
      (pTVar16->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_0211bbe0;
      tcu::TestNode::addChild((TestNode *)local_ea8,(TestNode *)pTVar16);
      pTVar16 = (TestCase *)operator_new(0xf8);
      TestCase::TestCase(pTVar16,eglTestCtx,"lose_context_on_reset",
                         "Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET"
                        );
      pTVar16[1].super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&pTVar16[1].super_TestCase.super_TestNode.m_name;
      pTVar16[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)&pTVar16[1].super_TestCase.super_TestNode.m_description;
      *(undefined8 *)((long)&pTVar16[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar16[1].m_eglTestCtx = (EglTestContext *)0x0;
      *(undefined4 *)&pTVar16[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
      (pTVar16->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_0211bc30;
      tcu::TestNode::addChild((TestNode *)local_ea8,(TestNode *)pTVar16);
      pTVar16 = (TestCase *)operator_new(0xf8);
      TestCase::TestCase(pTVar16,eglTestCtx,"invalid_robust_context_creation",
                         "Create a non-robust context but specify a reset notification strategy");
      pTVar16[1].super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&pTVar16[1].super_TestCase.super_TestNode.m_name;
      pTVar16[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)&pTVar16[1].super_TestCase.super_TestNode.m_description;
      *(undefined8 *)((long)&pTVar16[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar16[1].m_eglTestCtx = (EglTestContext *)0x0;
      *(undefined4 *)&pTVar16[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
      (pTVar16->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_0211bc80;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar16);
      pTVar16 = (TestCase *)operator_new(0xf8);
      TestCase::TestCase(pTVar16,eglTestCtx,"invalid_robust_shared_context_creation",
                         "Create a context share group with conflicting reset notification strategies"
                        );
      pTVar16[1].super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&pTVar16[1].super_TestCase.super_TestNode.m_name;
      pTVar16[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)&pTVar16[1].super_TestCase.super_TestNode.m_description;
      *(undefined8 *)((long)&pTVar16[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      *(undefined1 *)&pTVar16[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar16[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar16[1].m_eglTestCtx = (EglTestContext *)0x0;
      *(undefined4 *)&pTVar16[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
      (pTVar16->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__RobustnessTestCase_0211bcd0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar16);
      tcu::TestNode::addChild((TestNode *)local_eb0,(TestNode *)pTVar11);
      tcu::TestNode::addChild((TestNode *)local_eb0,(TestNode *)local_a08);
      tcu::TestNode::addChild((TestNode *)local_eb0,(TestNode *)local_a10);
      tcu::TestNode::addChild((TestNode *)local_eb8,(TestNode *)local_eb0);
      tcu::TestNode::addChild((TestNode *)local_eb8,(TestNode *)pTVar15);
      tcu::TestNode::addChild((TestNode *)local_eb8,(TestNode *)local_a18);
      tcu::TestNode::addChild((TestNode *)local_ec8,(TestNode *)local_ea8);
      tcu::TestNode::addChild((TestNode *)local_ec8,(TestNode *)local_eb8);
      tcu::TestNode::addChild((TestNode *)local_ec8,(TestNode *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)recoverScenarioDescription._M_dataplus._M_p != &recoverScenarioDescription.field_2) {
        operator_delete(recoverScenarioDescription._M_dataplus._M_p,
                        recoverScenarioDescription.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sharedScenarioDescription._M_dataplus._M_p != &sharedScenarioDescription.field_2) {
        operator_delete(sharedScenarioDescription._M_dataplus._M_p,
                        sharedScenarioDescription.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)queryScenarioDescription._M_dataplus._M_p != &queryScenarioDescription.field_2) {
        operator_delete(queryScenarioDescription._M_dataplus._M_p,
                        queryScenarioDescription.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)syncScenarioDescription._M_dataplus._M_p != &syncScenarioDescription.field_2) {
        operator_delete(syncScenarioDescription._M_dataplus._M_p,
                        syncScenarioDescription.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resetScenarioDescription._M_dataplus._M_p != &resetScenarioDescription.field_2) {
        operator_delete(resetScenarioDescription._M_dataplus._M_p,
                        resetScenarioDescription.field_2._M_allocated_capacity + 1);
      }
      return local_ec8;
    }
  } while( true );
}

Assistant:

TestCaseGroup* createRobustnessTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "robustness", "KHR_robustness tests"));

	tcu::TestCaseGroup* const contextCreationTestGroup			= new TestCaseGroup(eglTestCtx, "create_context",						"Test valid context_creation attributes");
	tcu::TestCaseGroup* const contextResetTestGroup				= new TestCaseGroup(eglTestCtx, "reset_context",						"Test context resets scenarios");
	tcu::TestCaseGroup* const negativeContextTestGroup			= new TestCaseGroup(eglTestCtx, "negative_context",						"Test invalid context creation attributes");

	tcu::TestCaseGroup* const shadersTestGroup					= new TestCaseGroup(eglTestCtx, "shaders",								"Shader specific context reset tests");
	tcu::TestCaseGroup* const fixedFunctionTestGroup			= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline",				"Fixed function pipeline context reset tests with robust context");
	tcu::TestCaseGroup* const fixedFunctionNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline_non_robust",	"Fixed function pipeline context reset tests with non-robust context");

	tcu::TestCaseGroup* const infiniteLoopTestGroup				= new TestCaseGroup(eglTestCtx, "infinite_loop",						"Infinite loop scenarios");
	tcu::TestCaseGroup* const outOfBoundsTestGroup				= new TestCaseGroup(eglTestCtx, "out_of_bounds",						"Out of bounds access scenarios with robust context");

	tcu::TestCaseGroup* const outOfBoundsNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "out_of_bounds_non_robust",				"Out of bounds access scenarios with non-robust context");

	const string resetScenarioDescription	= "query error states and reset notifications";
	const string syncScenarioDescription	= "query sync status with getSynciv()";
	const string queryScenarioDescription	= "check availability of query result with getQueryObjectiv()";
	const string sharedScenarioDescription	= "check reset notification is propagated to shared context";
	const string recoverScenarioDescription	= "delete the old context and create a new one";

	// infinite loop test cases
	{
		tcu::TestCaseGroup* const infiniteLoopResetTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",				"Tests that query the reset status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSyncTestGroup		= new TestCaseGroup(eglTestCtx, "sync_status",				"Tests that query the sync status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopQueryTestGroup	= new TestCaseGroup(eglTestCtx, "query_status",				"Tests that query the state of a query object after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSharedTestGroup	= new TestCaseGroup(eglTestCtx, "shared_context_status",	"Tests that query the state of a shared context after a reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopRecoverTestGroup	= new TestCaseGroup(eglTestCtx, "recover_from_reset",		"Tests that attempt to create a new context after a context has occurred");

		static const RobustnessTestCase::Params s_infiniteLoopCases[] =
		{
			RobustnessTestCase::Params("vertex",				"Provoke a context reset in vertex shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT),
			RobustnessTestCase::Params("fragment",				"Provoke a context reset in fragment shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_FRAG),
			RobustnessTestCase::Params("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT_AND_FRAG),
			RobustnessTestCase::Params("compute",				"Provoke a context reset in compute shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_COMPUTE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_infiniteLoopCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_infiniteLoopCases[testNdx];
			infiniteLoopResetTestGroup->addChild	(new BasicResetCase				(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
			infiniteLoopSyncTestGroup->addChild		(new SyncObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + syncScenarioDescription).c_str(), test));
			infiniteLoopQueryTestGroup->addChild	(new QueryObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + queryScenarioDescription).c_str(), test));
			infiniteLoopSharedTestGroup->addChild	(new SharedContextResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + sharedScenarioDescription).c_str(), test));
			infiniteLoopRecoverTestGroup->addChild	(new RecoverFromResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + recoverScenarioDescription).c_str(), test));
		}

		infiniteLoopTestGroup->addChild(infiniteLoopResetTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSyncTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopQueryTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSharedTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopRecoverTestGroup);
	}

	// out-of-bounds test cases
	{
		// robust context
		tcu::TestCaseGroup* const uboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const uboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		static const RobustnessTestCase::Params s_outOfBoundReadCases[] =
		{
			// ubo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),

			// ubo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundReadCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundReadCases[testNdx];

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				uboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				uboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				ssboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				ssboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				localReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				localReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		static const RobustnessTestCase::Params s_outOfBoundWriteCases[] =
		{
			// ubo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),

			// ubo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundWriteCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundWriteCases[testNdx];

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					uboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					uboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					ssboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					ssboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					localWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					localWriteArrayResetNonRobustTestGroup->addChild	(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		// robust Context
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessTestGroup->addChild(uboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(ssboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(localReadArrayResetTestGroup);

		outOfBoundsResetWriteAccessTestGroup->addChild(uboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(ssboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(localWriteArrayResetTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetTestGroup->addChild(outOfBoundsResetReadAccessTestGroup);
		outOfBoundsResetTestGroup->addChild(outOfBoundsResetWriteAccessTestGroup);

		outOfBoundsTestGroup->addChild(outOfBoundsResetTestGroup);

		// non-robust Context (internal use only)
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(uboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(ssboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(localReadArrayResetNonRobustTestGroup);

		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(uboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(ssboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(localWriteArrayResetNonRobustTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetReadAccessNonRobustTestGroup);
		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetWriteAccessNonRobustTestGroup);

		outOfBoundsNonRobustTestGroup->addChild(outOfBoundsResetNonRobustTestGroup);
	}

	// fixed function test cases
	{
		// robust context
		tcu::TestCaseGroup* const fixedFunctionResetStatusTestGroup				= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const fixedFunctionResetStatusNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		static const RobustnessTestCase::Params s_fixedFunctionPipelineCases[] =
		{
			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),

			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_fixedFunctionPipelineCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_fixedFunctionPipelineCases[testNdx];
			if (test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				fixedFunctionResetStatusTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
			else
				fixedFunctionResetStatusNonRobustTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
		}

		fixedFunctionTestGroup->addChild(fixedFunctionResetStatusTestGroup);
		fixedFunctionNonRobustTestGroup->addChild(fixedFunctionResetStatusNonRobustTestGroup);
	}

	// context creation query cases
	{
		contextCreationTestGroup->addChild(new QueryRobustAccessCase	(eglTestCtx, "query_robust_access",		"Query robust access after successfully creating a robust context"));
		contextCreationTestGroup->addChild(new NoResetNotificationCase	(eglTestCtx, "no_reset_notification",	"Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION"));
		contextCreationTestGroup->addChild(new LoseContextOnResetCase	(eglTestCtx, "lose_context_on_reset",	"Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET"));
	}

	// invalid context creation cases
	{
		negativeContextTestGroup->addChild(new InvalidContextCase		(eglTestCtx, "invalid_robust_context_creation",			"Create a non-robust context but specify a reset notification strategy"));
		negativeContextTestGroup->addChild(new InvalidShareContextCase	(eglTestCtx, "invalid_robust_shared_context_creation",	"Create a context share group with conflicting reset notification strategies"));
	}

	shadersTestGroup->addChild(infiniteLoopTestGroup);
	shadersTestGroup->addChild(outOfBoundsTestGroup);
	shadersTestGroup->addChild(outOfBoundsNonRobustTestGroup);

	contextResetTestGroup->addChild(shadersTestGroup);
	contextResetTestGroup->addChild(fixedFunctionTestGroup);
	contextResetTestGroup->addChild(fixedFunctionNonRobustTestGroup);

	group->addChild(contextCreationTestGroup);
	group->addChild(contextResetTestGroup);
	group->addChild(negativeContextTestGroup);

	return group.release();
}